

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_util.cpp
# Opt level: O2

CBlockPolicyEstimator * EnsureFeeEstimator(NodeContext *node)

{
  CBlockPolicyEstimator *pCVar1;
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  allocator<char> local_41;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (node->fee_estimator)._M_t.
           super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
           ._M_t.
           super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>
           .super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl;
  if (pCVar1 == (CBlockPolicyEstimator *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Fee estimation disabled",&local_41);
    JSONRPCError(__return_storage_ptr__,-0x7f5b,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pCVar1;
  }
  __stack_chk_fail();
}

Assistant:

CBlockPolicyEstimator& EnsureFeeEstimator(const NodeContext& node)
{
    if (!node.fee_estimator) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Fee estimation disabled");
    }
    return *node.fee_estimator;
}